

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void ImFontGlyphRangesBuilder_AddChar(ImFontGlyphRangesBuilder *self,ImWchar c)

{
  uint *puVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  
  uVar2 = CONCAT62(in_register_00000032,c) >> 5 & 0x7ffffff;
  if ((int)uVar2 < (self->UsedChars).Size) {
    puVar1 = (self->UsedChars).Data + uVar2;
    *puVar1 = *puVar1 | 1 << ((byte)c & 0x1f);
    return;
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4d8,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
}

Assistant:

inline bool     GetBit(int n) const { int off = (n >> 5); ImU32 mask = 1u << (n & 31); return (UsedChars[off] & mask) != 0; }